

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearAction::IfcStructuralLinearAction
          (IfcStructuralLinearAction *this,void **vtt)

{
  void *pvVar1;
  
  IfcStructuralAction::IfcStructuralAction(&this->super_IfcStructuralAction,vtt + 1);
  pvVar1 = vtt[0x28];
  *(void **)&(this->super_IfcStructuralAction).field_0x178 = pvVar1;
  *(void **)(&(this->super_IfcStructuralAction).field_0x178 + *(long *)((long)pvVar1 + -0x18)) =
       vtt[0x29];
  *(undefined8 *)&(this->super_IfcStructuralAction).field_0x180 = 0;
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
              super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x2a];
  *(void **)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject.field_0x88 = vtt[0x2b];
  (this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x2c];
  *(void **)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject.field_0xd0 = vtt[0x2d];
  *(void **)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             field_0x100 = vtt[0x2e];
  *(void **)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.field_0x138 = vtt[0x2f];
  *(void **)&(this->super_IfcStructuralAction).field_0x178 = vtt[0x30];
  *(undefined1 **)&(this->super_IfcStructuralAction).field_0x188 = &this->field_0x198;
  *(undefined8 *)&this->field_0x190 = 0;
  this->field_0x198 = 0;
  return;
}

Assistant:

IfcStructuralLinearAction() : Object("IfcStructuralLinearAction") {}